

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSExportEntry * find_export_entry(JSContext *ctx,JSModuleDef *m,JSAtom export_name)

{
  list_head *plVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = (ulong)*(uint *)&ctx->binary_object_count;
  if ((int)*(uint *)&ctx->binary_object_count < 1) {
    uVar3 = 0;
  }
  lVar2 = -0x20;
  do {
    lVar4 = lVar2;
    if (uVar3 * 0x20 == lVar4 + 0x20) {
      return (JSExportEntry *)0x0;
    }
    plVar1 = (ctx->link).next;
    lVar2 = lVar4 + 0x20;
  } while (*(int *)((long)&plVar1[3].next + lVar4) != (int)m);
  return (JSExportEntry *)((long)&plVar1[2].prev + lVar4);
}

Assistant:

static JSExportEntry *find_export_entry(JSContext *ctx, JSModuleDef *m,
                                        JSAtom export_name)
{
    JSExportEntry *me;
    int i;
    for(i = 0; i < m->export_entries_count; i++) {
        me = &m->export_entries[i];
        if (me->export_name == export_name)
            return me;
    }
    return NULL;
}